

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.h
# Opt level: O0

void __thiscall
lscpp::transporter::impl<lscpp::stdio_transporter>::~impl(impl<lscpp::stdio_transporter> *this)

{
  impl<lscpp::stdio_transporter> *this_local;
  
  ~impl(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

impl(Transporter t) : t_(std::move(t)) {}